

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  sqlite3 *db_00;
  Trigger *pTrig;
  char zErr [128];
  HashElem *pEntry;
  Db *pDb;
  int i;
  sqlite3 *db;
  char *zName;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db = (sqlite3 *)sqlite3_value_text(*argv);
  db_00 = sqlite3_context_db_handle(context);
  pEntry = (HashElem *)0x0;
  if (db == (sqlite3 *)0x0) {
    db = (sqlite3 *)0x2ce85e;
  }
  pDb._4_4_ = 0;
  while ((pDb._4_4_ < db_00->nDb &&
         ((pEntry = (HashElem *)(db_00->aDb + pDb._4_4_), ((Db *)pEntry)->pBt == (Btree *)0x0 ||
          (iVar2 = sqlite3DbIsNamed(db_00,pDb._4_4_,(char *)db), iVar2 == 0))))) {
    pDb._4_4_ = pDb._4_4_ + 1;
  }
  if (pDb._4_4_ < db_00->nDb) {
    if (pDb._4_4_ < 2) {
      sqlite3_snprintf(0x80,(char *)&pTrig,"cannot detach database %s",db);
    }
    else {
      iVar2 = sqlite3BtreeTxnState((Btree *)pEntry->prev);
      if ((iVar2 == 0) && (iVar2 = sqlite3BtreeIsInBackup((Btree *)pEntry->prev), iVar2 == 0)) {
        for (zErr._120_8_ = ((db_00->aDb[1].pSchema)->trigHash).first; zErr._120_8_ != 0;
            zErr._120_8_ = *(undefined8 *)zErr._120_8_) {
          lVar1 = *(long *)(zErr._120_8_ + 0x10);
          if (*(char **)(lVar1 + 0x30) == pEntry->pKey) {
            *(undefined8 *)(lVar1 + 0x30) = *(undefined8 *)(lVar1 + 0x28);
          }
        }
        sqlite3BtreeClose((Btree *)pEntry->prev);
        pEntry->prev = (HashElem *)0x0;
        pEntry->pKey = (char *)0x0;
        sqlite3CollapseDatabaseArray(db_00);
        return;
      }
      sqlite3_snprintf(0x80,(char *)&pTrig,"database %s is locked",db);
    }
  }
  else {
    sqlite3_snprintf(0x80,(char *)&pTrig,"no such database: %s",db);
  }
  sqlite3_result_error(context,(char *)&pTrig,-1);
  return;
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  HashElem *pEntry;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3DbIsNamed(db, i, zName) ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( sqlite3BtreeTxnState(pDb->pBt)!=SQLITE_TXN_NONE
   || sqlite3BtreeIsInBackup(pDb->pBt)
  ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  /* If any TEMP triggers reference the schema being detached, move those
  ** triggers to reference the TEMP schema itself. */
  assert( db->aDb[1].pSchema );
  pEntry = sqliteHashFirst(&db->aDb[1].pSchema->trigHash);
  while( pEntry ){
    Trigger *pTrig = (Trigger*)sqliteHashData(pEntry);
    if( pTrig->pTabSchema==pDb->pSchema ){
      pTrig->pTabSchema = pTrig->pSchema;
    }
    pEntry = sqliteHashNext(pEntry);
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}